

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O2

bool __thiscall csv::CSVField::try_parse_hex(CSVField *this,int *parsedValue)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __pos;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  
  uVar1 = (this->sv)._M_len;
  pcVar2 = (this->sv)._M_str;
  for (uVar5 = 0; (__pos = uVar1, uVar1 != uVar5 && (__pos = uVar5, pcVar2[uVar5] == ' '));
      uVar5 = uVar5 + 1) {
  }
  uVar5 = __pos;
  uVar6 = uVar1;
  if (uVar1 < __pos) {
    uVar6 = __pos;
  }
  for (; (uVar7 = uVar6, uVar5 < uVar1 && (uVar7 = uVar5, pcVar2[uVar5] != ' ')); uVar5 = uVar5 + 1)
  {
  }
  iVar8 = 0;
  __n = uVar7 - __pos;
  if (__n != 0) {
    bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&this->sv,__pos,__n);
    for (sVar4 = 0; __n = __n - 1, bVar11._M_len != sVar4; sVar4 = sVar4 + 1) {
      bVar3 = bVar11._M_str[sVar4] - 0x30;
      if ((0x36 < bVar3) || ((0x7e0000007e03ffU >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        iVar8 = 0;
        goto LAB_00109047;
      }
      auVar10._8_4_ = (int)(__n >> 0x20);
      auVar10._0_8_ = __n;
      auVar10._12_4_ = 0x45300000;
      dVar9 = exp2(((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)) * 4.0);
      iVar8 = iVar8 + (int)dVar9 * *(int *)(&DAT_001104b4 + (ulong)bVar3 * 4);
    }
    *parsedValue = iVar8;
    iVar8 = 1;
  }
LAB_00109047:
  return SUB41(iVar8,0);
}

Assistant:

CSV_INLINE bool CSVField::try_parse_hex(int& parsedValue) {
        size_t start = 0, end = 0;

        // Trim out whitespace chars
        for (; start < this->sv.size() && this->sv[start] == ' '; start++);
        for (end = start; end < this->sv.size() && this->sv[end] != ' '; end++);
        
        int value_ = 0;

        size_t digits = (end - start);
        size_t base16_exponent = digits - 1;

        if (digits == 0) return false;

        for (const auto& ch : this->sv.substr(start, digits)) {
            int digit = 0;

            switch (ch) {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                digit = static_cast<int>(ch - '0');
                break;
            case 'a':
            case 'A':
                digit = 10;
                break;
            case 'b':
            case 'B':
                digit = 11;
                break;
            case 'c':
            case 'C':
                digit = 12;
                break;
            case 'd':
            case 'D':
                digit = 13;
                break;
            case 'e':
            case 'E':
                digit = 14;
                break;
            case 'f':
            case 'F':
                digit = 15;
                break;
            default:
                return false;
            }

            value_ += digit * (int)pow(16, (double)base16_exponent);
            base16_exponent--;
        }

        parsedValue = value_;
        return true;
    }